

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::SetScrollTop(Element *this,float scroll_top)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Dictionary local_28;
  
  fVar2 = Math::Round(scroll_top);
  fVar3 = GetScrollHeight(this);
  fVar4 = GetClientHeight(this);
  fVar5 = fVar3 - fVar4;
  if (fVar2 <= fVar3 - fVar4) {
    fVar5 = fVar2;
  }
  fVar5 = Math::Round((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar5));
  pfVar1 = &(this->scroll_offset).y;
  if ((fVar5 != *pfVar1) || (NAN(fVar5) || NAN(*pfVar1))) {
    (this->scroll_offset).y = fVar5;
    ElementScroll::UpdateScrollbar(&this->meta->scroll,VERTICAL);
    DirtyAbsoluteOffset(this);
    local_28.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DispatchEvent(this,Scroll,&local_28);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_28.m_container);
  }
  return;
}

Assistant:

void Element::SetScrollTop(float scroll_top)
{
	const float new_offset = Math::Round(Math::Clamp(Math::Round(scroll_top), 0.0f, GetScrollHeight() - GetClientHeight()));
	if (new_offset != scroll_offset.y)
	{
		scroll_offset.y = new_offset;
		meta->scroll.UpdateScrollbar(ElementScroll::VERTICAL);
		DirtyAbsoluteOffset();

		DispatchEvent(EventId::Scroll, Dictionary());
	}
}